

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

double __thiscall
ParserProbModelXML::QueryTable
          (ParserProbModelXML *this,xmlNodePtr node,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          *t0_deps,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *t1_deps)

{
  int iVar1;
  Index IVar2;
  xmlNodePtr pxVar3;
  const_reference pvVar4;
  ParserProbModelXML *pPVar5;
  const_iterator cVar6;
  EParse *pEVar7;
  ostream *poVar8;
  ParserProbModelXML *this_00;
  char *this_01;
  ParserProbModelXML *pPVar9;
  value_type vVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  xmlNodePtr local_2a8;
  vector<double,_std::allocator<double>_> *local_2a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> factor_values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> factor_sizes;
  undefined1 local_258 [32];
  undefined1 local_238 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string name;
  
  pPVar9 = (ParserProbModelXML *)local_238;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pPVar9,"Values",(allocator<char> *)&name);
  pPVar5 = (ParserProbModelXML *)node;
  pxVar3 = FindChild(pPVar9,node,(string *)local_238);
  std::__cxx11::string::~string((string *)local_238);
  if (pxVar3 == (xmlNodePtr)0x0) {
    pEVar7 = (EParse *)__cxa_allocate_exception(0x28);
    GetVariableName_abi_cxx11_(&local_2c8,pPVar5,node);
    std::operator+(&name,"Variable ",&local_2c8);
    std::operator+(&local_1d8,&name," has an empty CPD");
    EParse::EParse(pEVar7,&local_1d8);
    __cxa_throw(pEVar7,&EParse::typeinfo,E::~E);
  }
  local_2a0 = ParseArray(this,pxVar3);
  if ((long)(local_2a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(local_2a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start == 8) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(local_2a0,0);
    vVar10 = *pvVar4;
  }
  else {
    pPVar9 = (ParserProbModelXML *)local_258;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pPVar9,"Variables",(allocator<char> *)&name);
    local_2a8 = node;
    pxVar3 = FindChild(pPVar9,node,(string *)local_258);
    pPVar5 = (ParserProbModelXML *)xmlLastElementChild(pxVar3);
    pPVar9 = (ParserProbModelXML *)local_258;
    std::__cxx11::string::~string((string *)pPVar9);
    factor_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    factor_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    factor_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (; pPVar5 != (ParserProbModelXML *)0x0;
        pPVar5 = (ParserProbModelXML *)
                 (pPVar5->_m_parsedElements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right)
    {
      if (*(int *)&pPVar5->_m_context == 1) {
        this_00 = pPVar5;
        iVar1 = GetVariableTimeslice(pPVar9,(xmlNodePtr)pPVar5);
        GetVariableName_abi_cxx11_(&name,this_00,(xmlNodePtr)pPVar5);
        if (iVar1 == 0) {
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                  ::find(&t0_deps->_M_t,(key_type *)&name);
        }
        else {
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                  ::find(&t1_deps->_M_t,(key_type *)&name);
        }
        if (((_Rb_tree_header *)cVar6._M_node == &(t0_deps->_M_t)._M_impl.super__Rb_tree_header) ||
           ((_Rb_tree_header *)cVar6._M_node == &(t1_deps->_M_t)._M_impl.super__Rb_tree_header)) {
          pEVar7 = (EParse *)__cxa_allocate_exception(0x28);
          std::operator+(&local_2c8,"Requested variable \"",&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_238 + 0x40),&local_2c8,
                         "\" which is not present in the dependencies of this CPT.");
          EParse::EParse(pEVar7,(string *)(local_238 + 0x40));
          __cxa_throw(pEVar7,&EParse::typeinfo,E::~E);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&factor_values,&cVar6._M_node[2]._M_color);
        local_2c8._M_dataplus._M_p = (pointer)(ulong)*(uint *)&cVar6._M_node[2].field_0x4;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&factor_sizes,(unsigned_long *)&local_2c8);
        pPVar9 = (ParserProbModelXML *)&name;
        std::__cxx11::string::~string((string *)&name);
      }
    }
    IVar2 = IndexTools::IndividualToJointIndices(&factor_values,&factor_sizes);
    if ((ulong)((long)(local_2a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_2a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)IVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&name);
      this_01 = "CPD indexed value for variable ";
      poVar8 = std::operator<<((ostream *)name.field_2._M_local_buf,
                               "CPD indexed value for variable ");
      GetVariableName_abi_cxx11_(&local_2c8,(ParserProbModelXML *)this_01,local_2a8);
      poVar8 = std::operator<<(poVar8,(string *)&local_2c8);
      std::operator<<(poVar8," out of bounds");
      std::__cxx11::string::~string((string *)&local_2c8);
      pEVar7 = (EParse *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      EParse::EParse(pEVar7,(string *)(local_238 + 0x20));
      __cxa_throw(pEVar7,&EParse::typeinfo,E::~E);
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(local_2a0,(ulong)IVar2);
    vVar10 = *pvVar4;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&factor_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return vVar10;
}

Assistant:

double ParserProbModelXML::QueryTable(const xmlNodePtr node,
                                      const std::map<std::string, std::pair<Index, Index> > t0_deps, 
                                      const std::map<std::string, std::pair<Index, Index> > t1_deps)
{
    xmlNodePtr data_node = FindChild(node, "Values");
    if(data_node == NULL)
        throw EParse("Variable " + GetVariableName(node) + " has an empty CPD");
    const vector<double>* data = ParseArray(data_node);

    if(data->size() == 1) //typically the case for rewards in ADDs
        return data->at(0);

    xmlNodePtr current = xmlLastElementChild(FindChild(node, "Variables"));
    vector<Index> factor_values;
    vector<size_t> factor_sizes;
    map<string, pair<Index, Index> >::const_iterator it;
        
    for(Index i = 0; current != NULL;)
    {
        if(current->type == XML_ELEMENT_NODE)
        {
            int timeslice = GetVariableTimeslice(current);
            string name = GetVariableName(current);
            if(timeslice == 0)
            {
                it = t0_deps.find(name);
            }
            else
            {
                it = t1_deps.find(name);
            }
            if(it == t0_deps.end() || it == t1_deps.end())
            {
              throw EParse("Requested variable \"" + name + "\" which is not present in the dependencies of this CPT.");
            }
            factor_values.push_back(it->second.first);
            factor_sizes.push_back(it->second.second);
            i++;
        }
        current = current->prev;
    }

    Index jIdx = IndexTools::IndividualToJointIndices(factor_values, factor_sizes);

    if(jIdx < data->size())
    {
      return data->at(jIdx);
    }
    else
    {
      stringstream ss;
      ss << "CPD indexed value for variable " << GetVariableName(node) << " out of bounds";
      throw EParse(ss.str());
    }
}